

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O0

string * pystring::do_strip(string *__return_storage_ptr__,string *str,int striptype,string *chars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  void *__s;
  void *pvVar5;
  bool bVar6;
  char *sep;
  Py_ssize_t charslen;
  Py_ssize_t j;
  Py_ssize_t i;
  Py_ssize_t len;
  string *chars_local;
  int striptype_local;
  string *str_local;
  
  iVar2 = std::__cxx11::string::size();
  iVar3 = std::__cxx11::string::size();
  sep._4_4_ = iVar2;
  if (iVar3 == 0) {
    charslen = 0;
    if (striptype != 1) {
      while( true ) {
        bVar6 = false;
        if (charslen < iVar2) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)str);
          iVar3 = ::isspace((int)*pcVar4);
          bVar6 = iVar3 != 0;
        }
        if (!bVar6) break;
        charslen = charslen + 1;
      }
    }
    iVar3 = iVar2;
    if (striptype != 0) {
      do {
        sep._4_4_ = iVar3;
        bVar6 = false;
        if (charslen <= sep._4_4_ + -1) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)str);
          iVar3 = ::isspace((int)*pcVar4);
          bVar6 = iVar3 != 0;
        }
        iVar3 = sep._4_4_ + -1;
      } while (bVar6);
    }
  }
  else {
    __s = (void *)std::__cxx11::string::c_str();
    charslen = 0;
    if (striptype != 1) {
      while( true ) {
        bVar6 = false;
        if (charslen < iVar2) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)str);
          pvVar5 = memchr(__s,(int)*pcVar4,(long)iVar3);
          bVar6 = pvVar5 != (void *)0x0;
        }
        if (!bVar6) break;
        charslen = charslen + 1;
      }
    }
    iVar1 = iVar2;
    if (striptype != 0) {
      do {
        sep._4_4_ = iVar1;
        bVar6 = false;
        if (charslen <= sep._4_4_ + -1) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)str);
          pvVar5 = memchr(__s,(int)*pcVar4,(long)iVar3);
          bVar6 = pvVar5 != (void *)0x0;
        }
        iVar1 = sep._4_4_ + -1;
      } while (bVar6);
    }
  }
  if ((charslen == 0) && (sep._4_4_ == iVar2)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string do_strip( const std::string & str, int striptype, const std::string & chars  )
    {
        Py_ssize_t len = (Py_ssize_t) str.size(), i, j, charslen = (Py_ssize_t) chars.size();

        if ( charslen == 0 )
        {
            i = 0;
            if ( striptype != RIGHTSTRIP )
            {
                while ( i < len && ::isspace( str[i] ) )
                {
                    i++;
                }
            }

            j = len;
            if ( striptype != LEFTSTRIP )
            {
                do
                {
                    j--;
                }
                while (j >= i && ::isspace(str[j]));

                j++;
            }


        }
        else
        {
            const char * sep = chars.c_str();

            i = 0;
            if ( striptype != RIGHTSTRIP )
            {
                while ( i < len && memchr(sep, str[i], charslen) )
                {
                    i++;
                }
            }

            j = len;
            if (striptype != LEFTSTRIP)
            {
                do
                {
                    j--;
                }
                while (j >= i &&  memchr(sep, str[j], charslen)  );
                j++;
            }


        }

        if ( i == 0 && j == len )
        {
            return str;
        }
        else
        {
            return str.substr( i, j - i );
        }

    }